

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadEXRWithLayer(float **out_rgba,int *width,int *height,char *filename,char *layername,
                    char **err)

{
  size_t sVar1;
  uchar *puVar2;
  uchar **ppuVar3;
  char **ppcVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  float *pfVar11;
  long lVar12;
  undefined4 *puVar13;
  size_t i_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar14;
  long lVar15;
  long lVar16;
  EXRTile *pEVar17;
  char *pcVar18;
  ulong uVar19;
  ulong uVar20;
  size_t j;
  ulong uVar21;
  long lVar22;
  size_t i_1;
  long lVar23;
  size_t pixel_size_1;
  char **ppcVar24;
  int c;
  pointer pcVar25;
  long lVar26;
  float fVar27;
  allocator local_471;
  int local_470;
  int local_46c;
  EXRTile *local_468;
  char **local_460;
  long local_458;
  long local_450;
  int *local_448;
  char **local_440;
  int *local_438;
  float **local_430;
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> channels;
  EXRImage exr_image;
  string ch_name;
  EXRVersion exr_version;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layer_names;
  EXRHeader exr_header;
  stringstream ss;
  string local_1d0 [8];
  ostream local_1c8 [376];
  string local_50 [32];
  
  if (out_rgba == (float **)0x0) {
    std::__cxx11::string::string
              ((string *)&exr_header,"Invalid argument for LoadEXR()",(allocator *)&ss);
    tinyexr::SetErrorMessage((string *)&exr_header,err);
    std::__cxx11::string::_M_dispose();
    return -3;
  }
  local_468 = (EXRTile *)layername;
  local_438 = width;
  local_430 = out_rgba;
  memset(&exr_header,0,0x188);
  exr_image.tiles = (EXRTile *)0x0;
  exr_image.next_level = (TEXRImage *)0x0;
  exr_image.level_x = 0;
  exr_image.level_y = 0;
  exr_image.images = (uchar **)0x0;
  exr_image.width = 0;
  exr_image.height = 0;
  exr_image.num_channels = 0;
  exr_image.num_tiles = 0;
  iVar6 = ParseEXRVersionFromFile(&exr_version,filename);
  if (iVar6 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar7 = std::operator<<(local_1c8,
                             "Failed to open EXR file or read version info from EXR file. code(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
    std::operator<<(poVar7,")");
    std::__cxx11::stringbuf::str();
    tinyexr::SetErrorMessage(&ch_name,err);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return iVar6;
  }
  if (exr_version.non_image != 0 || exr_version.multipart != 0) {
    std::__cxx11::string::string
              ((string *)&ss,"Loading multipart or DeepImage is not supported  in LoadEXR() API",
               (allocator *)&ch_name);
    tinyexr::SetErrorMessage((string *)&ss,err);
    std::__cxx11::string::_M_dispose();
    return -4;
  }
  iVar6 = ParseEXRHeaderFromFile(&exr_header,&exr_version,filename,err);
  if (iVar6 != 0) {
LAB_0044ee42:
    FreeEXRHeader(&exr_header);
    return iVar6;
  }
  for (lVar12 = 0; lVar12 < exr_header.num_channels; lVar12 = lVar12 + 1) {
    if (exr_header.pixel_types[lVar12] == 1) {
      exr_header.requested_pixel_types[lVar12] = 2;
    }
  }
  iVar6 = LoadEXRImageFromFile(&exr_image,&exr_header,filename,err);
  if (iVar6 != 0) goto LAB_0044ee42;
  layer_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  layer_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  layer_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tinyexr::GetLayers(&exr_header,&layer_names);
  channels.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  channels.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  channels.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar17 = local_468;
  if (local_468 == (EXRTile *)0x0) {
    pEVar17 = (EXRTile *)0x4a8b33;
  }
  local_448 = height;
  local_440 = err;
  std::__cxx11::string::string((string *)&local_398,(char *)pEVar17,&local_471);
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::clear(&channels);
  lVar12 = 0;
  for (pcVar25 = (pointer)0x0; (long)pcVar25 < (long)exr_header.num_channels; pcVar25 = pcVar25 + 1)
  {
    std::__cxx11::string::string
              ((string *)&ch_name,(exr_header.channels)->name + lVar12,(allocator *)&ss);
    if (local_398._M_string_length == 0) {
      uVar9 = std::__cxx11::string::rfind((char)&ch_name,0x2e);
      if ((uVar9 == 0xffffffffffffffff) || (ch_name._M_string_length <= uVar9)) goto LAB_0044ef97;
      if (uVar9 == 0) goto LAB_0044ef7c;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &local_398,'.');
      lVar8 = std::__cxx11::string::find((string *)&ch_name,(ulong)&ss);
      std::__cxx11::string::_M_dispose();
      if (lVar8 != -1) {
        if (lVar8 == 0) {
LAB_0044ef7c:
          std::__cxx11::string::substr((ulong)&ss,(ulong)&ch_name);
          std::__cxx11::string::operator=((string *)&ch_name,(string *)&ss);
          std::__cxx11::string::_M_dispose();
        }
LAB_0044ef97:
        std::__cxx11::string::string(local_50,(string *)&ch_name);
        _ss = pcVar25;
        std::__cxx11::string::string(local_1d0,local_50);
        std::__cxx11::string::_M_dispose();
        std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::push_back
                  (&channels,(value_type *)&ss);
        std::__cxx11::string::_M_dispose();
      }
    }
    std::__cxx11::string::_M_dispose();
    lVar12 = lVar12 + 0x110;
  }
  std::__cxx11::string::_M_dispose();
  ppcVar4 = local_440;
  if (local_468 == (EXRTile *)0x0) {
    if (channels.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        channels.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
        _M_impl.super__Vector_impl_data._M_start) goto LAB_0044f046;
    pcVar18 = 
    "Layer Not Found. Seems EXR contains channels with layer(e.g. `diffuse.R`). if you are using LoadEXR(), please try LoadEXRWithLayer(). LoadEXR() cannot load EXR having channels with layer."
    ;
  }
  else {
    if (channels.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        channels.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
        _M_impl.super__Vector_impl_data._M_start) {
LAB_0044f046:
      uVar10 = ((long)channels.
                      super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)channels.
                     super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x28;
      uVar9 = 4;
      if (uVar10 < 4) {
        uVar9 = uVar10;
      }
      local_460 = (char **)CONCAT44(local_460._4_4_,0xffffffff);
      local_458 = CONCAT44(local_458._4_4_,0xffffffff);
      local_468 = (EXRTile *)CONCAT44(local_468._4_4_,0xffffffff);
      local_450 = CONCAT44(local_450._4_4_,0xffffffff);
      for (lVar12 = 0; uVar9 * 0x28 - lVar12 != 0; lVar12 = lVar12 + 0x28) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&((channels.
                          super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                          ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                lVar12);
        puVar13 = (undefined4 *)
                  ((long)&(channels.
                           super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                           ._M_impl.super__Vector_impl_data._M_start)->index + lVar12);
        bVar5 = std::operator==(__lhs,"R");
        if (bVar5) {
          local_450 = CONCAT44(local_450._4_4_,*puVar13);
        }
        else {
          bVar5 = std::operator==(__lhs,"G");
          if (bVar5) {
            local_458 = CONCAT44(local_458._4_4_,*puVar13);
          }
          else {
            bVar5 = std::operator==(__lhs,"B");
            if (bVar5) {
              local_460 = (char **)CONCAT44(local_460._4_4_,*puVar13);
            }
            else {
              bVar5 = std::operator==(__lhs,"A");
              if (bVar5) {
                local_468 = (EXRTile *)CONCAT44(local_468._4_4_,*puVar13);
              }
            }
          }
        }
      }
      if ((long)channels.
                super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)channels.
                super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x28) {
        sVar1 = (channels.
                 super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                 _M_impl.super__Vector_impl_data._M_start)->index;
        local_46c = exr_image.width;
        uVar9 = (ulong)exr_image.width;
        local_470 = exr_image.height;
        uVar10 = (ulong)exr_image.height;
        lVar12 = uVar9 * uVar10;
        pfVar11 = (float *)malloc(lVar12 * 0x10);
        *local_430 = pfVar11;
        iVar6 = (int)sVar1;
        if (exr_header.tiled == 0) {
          for (lVar8 = 0; lVar12 - lVar8 != 0; lVar8 = lVar8 + 1) {
            fVar27 = *(float *)(exr_image.images[iVar6] + lVar8 * 4);
            *pfVar11 = fVar27;
            pfVar11[1] = fVar27;
            pfVar11[2] = fVar27;
            pfVar11[3] = fVar27;
            pfVar11 = pfVar11 + 4;
          }
        }
        else {
          lVar12 = (long)exr_header.tile_size_x;
          local_468 = exr_image.tiles;
          uVar20 = 0;
          uVar21 = (ulong)(uint)exr_image.num_tiles;
          if (exr_image.num_tiles < 1) {
            uVar21 = uVar20;
          }
          for (; uVar20 != uVar21; uVar20 = uVar20 + 1) {
            pEVar17 = exr_image.tiles + uVar20;
            lVar26 = 0;
            for (lVar8 = 0; lVar8 != exr_header.tile_size_y; lVar8 = lVar8 + 1) {
              for (lVar23 = 0; lVar12 != lVar23; lVar23 = lVar23 + 1) {
                uVar14 = pEVar17->offset_x * lVar12 + lVar23;
                if ((uVar14 < uVar9) &&
                   (uVar19 = (long)pEVar17->offset_y * (long)exr_header.tile_size_y + lVar8,
                   uVar19 < uVar10)) {
                  lVar15 = uVar14 + uVar19 * uVar9;
                  puVar2 = pEVar17->images[iVar6];
                  fVar27 = *(float *)(puVar2 + lVar23 * 4 + lVar26);
                  pfVar11[lVar15 * 4] = fVar27;
                  pfVar11[lVar15 * 4 + 1] = fVar27;
                  fVar27 = *(float *)(puVar2 + lVar23 * 4 + lVar26);
                  pfVar11[lVar15 * 4 + 2] = fVar27;
                  pfVar11[lVar15 * 4 + 3] = fVar27;
                }
              }
              lVar26 = lVar26 + lVar12 * 4;
            }
          }
        }
LAB_0044f48b:
        *local_438 = local_46c;
        *local_448 = local_470;
        iVar6 = 0;
      }
      else {
        if ((int)local_450 == -1) {
          pcVar18 = "R channel not found";
        }
        else if ((int)local_458 == -1) {
          pcVar18 = "G channel not found";
        }
        else {
          if ((int)local_460 != -1) {
            local_46c = exr_image.width;
            uVar10 = (ulong)exr_image.width;
            local_470 = exr_image.height;
            uVar9 = (ulong)exr_image.height;
            lVar12 = uVar10 * uVar9;
            pfVar11 = (float *)malloc(lVar12 * 0x10);
            *local_430 = pfVar11;
            if (exr_header.tiled == 0) {
              pfVar11 = pfVar11 + 3;
              for (lVar8 = 0; lVar12 - lVar8 != 0; lVar8 = lVar8 + 1) {
                pfVar11[-3] = *(float *)(exr_image.images[(int)local_450] + lVar8 * 4);
                pfVar11[-2] = *(float *)(exr_image.images[(int)local_458] + lVar8 * 4);
                pfVar11[-1] = *(float *)(exr_image.images[(int)local_460] + lVar8 * 4);
                fVar27 = 1.0;
                if ((int)local_468 != -1) {
                  fVar27 = *(float *)(exr_image.images[(int)local_468] + lVar8 * 4);
                }
                *pfVar11 = fVar27;
                pfVar11 = pfVar11 + 4;
              }
            }
            else {
              lVar12 = (long)exr_header.tile_size_x;
              local_430 = (float **)(long)(int)local_450;
              lVar8 = (long)(int)local_458;
              lVar26 = (long)(int)local_460;
              local_450 = (long)(int)local_468;
              local_440 = (char **)(ulong)(uint)exr_image.num_tiles;
              if (exr_image.num_tiles < 1) {
                local_440 = (char **)0x0;
              }
              local_458 = lVar12 * 4;
              ppcVar4 = (char **)0x0;
              while (ppcVar24 = ppcVar4, ppcVar24 != local_440) {
                pEVar17 = exr_image.tiles + (long)ppcVar24;
                lVar15 = 0;
                for (lVar23 = 0; lVar23 != exr_header.tile_size_y; lVar23 = lVar23 + 1) {
                  for (lVar16 = 0; lVar12 != lVar16; lVar16 = lVar16 + 1) {
                    uVar21 = pEVar17->offset_x * lVar12 + lVar16;
                    if ((uVar21 < uVar10) &&
                       (uVar20 = (long)pEVar17->offset_y * (long)exr_header.tile_size_y + lVar23,
                       uVar20 < uVar9)) {
                      lVar22 = uVar21 + uVar20 * uVar10;
                      ppuVar3 = pEVar17->images;
                      pfVar11[lVar22 * 4] =
                           *(float *)(ppuVar3[(long)local_430] + lVar16 * 4 + lVar15);
                      pfVar11[lVar22 * 4 + 1] = *(float *)(ppuVar3[lVar8] + lVar16 * 4 + lVar15);
                      pfVar11[lVar22 * 4 + 2] = *(float *)(ppuVar3[lVar26] + lVar16 * 4 + lVar15);
                      fVar27 = 1.0;
                      if ((int)local_468 != -1) {
                        fVar27 = *(float *)(ppuVar3[local_450] + lVar16 * 4 + lVar15);
                      }
                      pfVar11[lVar22 * 4 + 3] = fVar27;
                    }
                  }
                  lVar15 = lVar15 + local_458;
                }
                local_460 = ppcVar24;
                ppcVar4 = (char **)((long)ppcVar24 + 1);
              }
            }
            goto LAB_0044f48b;
          }
          pcVar18 = "B channel not found";
        }
        std::__cxx11::string::string((string *)&ss,pcVar18,(allocator *)&ch_name);
        tinyexr::SetErrorMessage((string *)&ss,ppcVar4);
        std::__cxx11::string::_M_dispose();
        iVar6 = -4;
      }
      goto LAB_0044f4d3;
    }
    pcVar18 = "Layer Not Found";
  }
  std::__cxx11::string::string((string *)&ss,pcVar18,(allocator *)&ch_name);
  tinyexr::SetErrorMessage((string *)&ss,ppcVar4);
  std::__cxx11::string::_M_dispose();
  iVar6 = -0xd;
LAB_0044f4d3:
  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::~vector(&channels);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&layer_names);
  return iVar6;
}

Assistant:

int LoadEXRWithLayer(float **out_rgba, int *width, int *height,
                     const char *filename, const char *layername,
                     const char **err) {
  if (out_rgba == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXR()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);
  InitEXRImage(&exr_image);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      std::stringstream ss;
      ss << "Failed to open EXR file or read version info from EXR file. code("
         << ret << ")";
      tinyexr::SetErrorMessage(ss.str(), err);
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      tinyexr::SetErrorMessage(
          "Loading multipart or DeepImage is not supported  in LoadEXR() API",
          err);
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  {
    int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  // TODO: Probably limit loading to layers (channels) selected by layer index
  {
    int ret = LoadEXRImageFromFile(&exr_image, &exr_header, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;

  std::vector<std::string> layer_names;
  tinyexr::GetLayers(exr_header, layer_names);

  std::vector<tinyexr::LayerChannel> channels;
  tinyexr::ChannelsInLayer(
      exr_header, layername == NULL ? "" : std::string(layername), channels);


  if (channels.size() < 1) {
    if (layername == NULL) {
      tinyexr::SetErrorMessage("Layer Not Found. Seems EXR contains channels with layer(e.g. `diffuse.R`). if you are using LoadEXR(), please try LoadEXRWithLayer(). LoadEXR() cannot load EXR having channels with layer.", err);

    } else {
      tinyexr::SetErrorMessage("Layer Not Found", err);
    }
    FreeEXRHeader(&exr_header);
    FreeEXRImage(&exr_image);
    return TINYEXR_ERROR_LAYER_NOT_FOUND;
  }

  size_t ch_count = channels.size() < 4 ? channels.size() : 4;
  for (size_t c = 0; c < ch_count; c++) {
    const tinyexr::LayerChannel &ch = channels[c];

    if (ch.name == "R") {
      idxR = int(ch.index);
    } else if (ch.name == "G") {
      idxG = int(ch.index);
    } else if (ch.name == "B") {
      idxB = int(ch.index);
    } else if (ch.name == "A") {
      idxA = int(ch.index);
    }
  }

  if (channels.size() == 1) {
    int chIdx = int(channels.front().index);
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      const size_t tile_size_x = static_cast<size_t>(exr_header.tile_size_x);
      const size_t tile_size_y = static_cast<size_t>(exr_header.tile_size_y);
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (size_t j = 0; j < tile_size_y; j++) {
          for (size_t i = 0; i < tile_size_x; i++) {
            const size_t ii =
              static_cast<size_t>(exr_image.tiles[it].offset_x) * tile_size_x +
              i;
            const size_t jj =
              static_cast<size_t>(exr_image.tiles[it].offset_y) * tile_size_y +
              j;
            const size_t idx = ii + jj * static_cast<size_t>(exr_image.width);

            // out of region check.
            if (ii >= static_cast<size_t>(exr_image.width)) {
              continue;
            }
            if (jj >= static_cast<size_t>(exr_image.height)) {
              continue;
            }
            const size_t srcIdx = i + j * tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
          }
        }
      }
    } else {
      const size_t pixel_size = static_cast<size_t>(exr_image.width) *
        static_cast<size_t>(exr_image.height);
      for (size_t i = 0; i < pixel_size; i++) {
        const float val =
            reinterpret_cast<float **>(exr_image.images)[chIdx][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }
  } else {
    // Assume RGB(A)

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));
    if (exr_header.tiled) {
      const size_t tile_size_x = static_cast<size_t>(exr_header.tile_size_x);
      const size_t tile_size_y = static_cast<size_t>(exr_header.tile_size_y);
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (size_t j = 0; j < tile_size_y; j++) {
          for (size_t i = 0; i < tile_size_x; i++) {
            const size_t ii =
                static_cast<size_t>(exr_image.tiles[it].offset_x) *
                    tile_size_x +
                i;
            const size_t jj =
                static_cast<size_t>(exr_image.tiles[it].offset_y) *
                    tile_size_y +
                j;
            const size_t idx = ii + jj * static_cast<size_t>(exr_image.width);

            // out of region check.
            if (ii >= static_cast<size_t>(exr_image.width)) {
              continue;
            }
            if (jj >= static_cast<size_t>(exr_image.height)) {
              continue;
            }
            const size_t srcIdx = i + j * tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
        }
      }
    } else {
      const size_t pixel_size = static_cast<size_t>(exr_image.width) *
        static_cast<size_t>(exr_image.height);
      for (size_t i = 0; i < pixel_size; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}